

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O0

base_learner * ftrl_setup(options_i *options,vw *all)

{
  float fVar1;
  vw *pvVar2;
  long *plVar3;
  byte bVar4;
  pointer pfVar5;
  ostream *poVar6;
  void *pvVar7;
  unsigned_long uVar8;
  vw *in_RSI;
  long *in_RDI;
  learner<ftrl,_example> *l;
  string algorithm_name;
  _func_void_ftrl_ptr_single_learner_ptr_example_ptr *learn_ptr;
  option_group_definition new_options;
  bool coin;
  bool pistol;
  bool ftrl_option;
  free_ptr<ftrl> b;
  undefined4 in_stack_fffffffffffff758;
  uint32_t in_stack_fffffffffffff75c;
  typed_option<float> *in_stack_fffffffffffff760;
  string *in_stack_fffffffffffff768;
  free_ptr<ftrl> *in_stack_fffffffffffff770;
  undefined4 in_stack_fffffffffffff778;
  uint32_t in_stack_fffffffffffff77c;
  learner<ftrl,_example> *in_stack_fffffffffffff780;
  string *in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff794;
  typed_option<float> *in_stack_fffffffffffff7a8;
  option_group_definition *in_stack_fffffffffffff7b0;
  allocator *paVar9;
  float local_7f4;
  float local_7d8;
  float local_7bc;
  float local_7a0;
  float local_784;
  float local_768;
  learner<ftrl,_example> *local_698;
  allocator local_689;
  string local_688 [32];
  string local_668 [32];
  free_ptr<ftrl> *local_648;
  allocator local_639;
  string local_638 [39];
  allocator local_611;
  string local_610 [39];
  allocator local_5e9;
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [39];
  allocator local_599;
  string local_598 [39];
  allocator local_571;
  string local_570 [32];
  undefined4 local_550;
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [199];
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [199];
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [32];
  typed_option<bool> local_320;
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [32];
  typed_option<bool> local_230;
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  typed_option<bool> local_140;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [61];
  byte local_2b;
  byte local_2a;
  byte local_29;
  vw *local_18;
  long *local_10;
  typed_option<float> *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<ftrl>();
  local_29 = 0;
  local_2a = 0;
  local_2b = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Follow the Regularized Leader",&local_89);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff760,
             (string *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"ftrl",&local_161);
  VW::config::make_option<bool>(in_stack_fffffffffffff768,(bool *)in_stack_fffffffffffff760);
  VW::config::typed_option<bool>::keep(&local_140,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"FTRL: Follow the Proximal Regularized Leader",&local_189);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff760,
             (string *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff7b0,(typed_option<bool> *)in_stack_fffffffffffff7a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"coin",&local_251);
  VW::config::make_option<bool>(in_stack_fffffffffffff768,(bool *)in_stack_fffffffffffff760);
  VW::config::typed_option<bool>::keep(&local_230,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"Coin betting optimizer",&local_279);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff760,
             (string *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff7b0,(typed_option<bool> *)in_stack_fffffffffffff7a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"pistol",&local_341);
  VW::config::make_option<bool>(in_stack_fffffffffffff768,(bool *)in_stack_fffffffffffff760);
  VW::config::typed_option<bool>::keep(&local_320,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"PiSTOL: Parameter-free STOchastic Learning",&local_369);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff760,
             (string *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff7b0,(typed_option<bool> *)in_stack_fffffffffffff7a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"ftrl_alpha",&local_431);
  std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
            ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31a3ad);
  VW::config::make_option<float>(in_stack_fffffffffffff768,(float *)in_stack_fffffffffffff760);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"Learning rate for FTRL optimization",&local_459);
  VW::config::typed_option<float>::help
            (in_stack_fffffffffffff760,
             (string *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"ftrl_beta",&local_521);
  std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
            ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31a47c);
  VW::config::make_option<float>(in_stack_fffffffffffff768,(float *)in_stack_fffffffffffff760);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"Learning rate for FTRL optimization",&local_549);
  VW::config::typed_option<float>::help
            (in_stack_fffffffffffff760,
             (string *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff760);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  VW::config::typed_option<float>::~typed_option(in_stack_fffffffffffff760);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff760);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff760);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff760);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  (**(code **)*local_10)(local_10,local_68);
  plVar3 = local_10;
  if ((((local_29 & 1) == 0) && ((local_2a & 1) == 0)) && ((local_2b & 1) == 0)) {
    local_8 = (typed_option<float> *)0x0;
    local_550 = 1;
  }
  else {
    if ((local_29 & 1) == 0) {
      if ((local_2a & 1) == 0) {
        if ((local_2b & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_610,"ftrl_alpha",&local_611);
          bVar4 = (**(code **)(*plVar3 + 8))(plVar3,local_610);
          if ((bVar4 & 1) == 0) {
            local_7d8 = 4.0;
          }
          else {
            pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                               ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31b000);
            local_7d8 = pfVar5->ftrl_alpha;
          }
          pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                             ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31b042);
          pfVar5->ftrl_alpha = local_7d8;
          std::__cxx11::string::~string(local_610);
          std::allocator<char>::~allocator((allocator<char> *)&local_611);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_638,"ftrl_beta",&local_639);
          bVar4 = (**(code **)(*local_10 + 8))(local_10,local_638);
          if ((bVar4 & 1) == 0) {
            local_7f4 = 1.0;
          }
          else {
            pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                               ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31b0e9);
            local_7f4 = pfVar5->ftrl_beta;
          }
          pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                             ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31b12b);
          pfVar5->ftrl_beta = local_7f4;
          std::__cxx11::string::~string(local_638);
          std::allocator<char>::~allocator((allocator<char> *)&local_639);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5c0,"ftrl_alpha",&local_5c1);
        bVar4 = (**(code **)(*plVar3 + 8))(plVar3,local_5c0);
        if ((bVar4 & 1) == 0) {
          local_7a0 = 1.0;
        }
        else {
          pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                             ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31ad89);
          local_7a0 = pfVar5->ftrl_alpha;
        }
        pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                           ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31adcb);
        pfVar5->ftrl_alpha = local_7a0;
        std::__cxx11::string::~string(local_5c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5e8,"ftrl_beta",&local_5e9);
        bVar4 = (**(code **)(*local_10 + 8))(local_10,local_5e8);
        if ((bVar4 & 1) == 0) {
          local_7bc = 0.5;
        }
        else {
          pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                             ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31ae72);
          local_7bc = pfVar5->ftrl_beta;
        }
        pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                           ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31aeb4);
        pfVar5->ftrl_beta = local_7bc;
        std::__cxx11::string::~string(local_5e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_570,"ftrl_alpha",&local_571);
      bVar4 = (**(code **)(*plVar3 + 8))(plVar3,local_570);
      if ((bVar4 & 1) == 0) {
        local_768 = 0.005;
      }
      else {
        pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                           ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31ab12);
        local_768 = pfVar5->ftrl_alpha;
      }
      pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31ab54);
      pfVar5->ftrl_alpha = local_768;
      std::__cxx11::string::~string(local_570);
      std::allocator<char>::~allocator((allocator<char> *)&local_571);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_598,"ftrl_beta",&local_599);
      bVar4 = (**(code **)(*local_10 + 8))(local_10,local_598);
      if ((bVar4 & 1) == 0) {
        local_784 = 0.1;
      }
      else {
        pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                           ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31abfb);
        local_784 = pfVar5->ftrl_beta;
      }
      pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31ac3d);
      pfVar5->ftrl_beta = local_784;
      std::__cxx11::string::~string(local_598);
      std::allocator<char>::~allocator((allocator<char> *)&local_599);
    }
    pvVar2 = local_18;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31b20b);
    pfVar5->all = pvVar2;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31b223);
    pfVar5->no_win_counter = 0;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31b238);
    pfVar5->all->normalized_sum_norm_x = 0.0;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31b253);
    pfVar5->total_weight = 0.0;
    local_648 = (free_ptr<ftrl> *)0x0;
    std::__cxx11::string::string(local_668);
    if ((local_29 & 1) == 0) {
      if ((local_2a & 1) == 0) {
        if ((local_2b & 1) != 0) {
          std::__cxx11::string::operator=(local_668,"Coin Betting");
          local_648 = (free_ptr<ftrl> *)learn_cb;
          parameters::stride_shift
                    ((parameters *)in_stack_fffffffffffff760,in_stack_fffffffffffff75c);
        }
      }
      else {
        std::__cxx11::string::operator=(local_668,"PiSTOL");
        local_648 = (free_ptr<ftrl> *)learn_pistol;
        parameters::stride_shift((parameters *)in_stack_fffffffffffff760,in_stack_fffffffffffff75c);
      }
    }
    else {
      std::__cxx11::string::operator=(local_668,"Proximal-FTRL");
      if ((local_18->audit & 1U) == 0) {
        local_648 = (free_ptr<ftrl> *)learn_proximal<false>;
      }
      else {
        local_648 = (free_ptr<ftrl> *)learn_proximal<true>;
      }
      parameters::stride_shift((parameters *)in_stack_fffffffffffff760,in_stack_fffffffffffff75c);
    }
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31b3ab);
    fVar1 = pfVar5->ftrl_alpha;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31b3c6);
    (pfVar5->data).ftrl_alpha = fVar1;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31b3e1);
    fVar1 = pfVar5->ftrl_beta;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31b3fc);
    (pfVar5->data).ftrl_beta = fVar1;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31b417);
    fVar1 = pfVar5->all->l1_lambda;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31b438);
    (pfVar5->data).l1_lambda = fVar1;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31b453);
    fVar1 = pfVar5->all->l2_lambda;
    pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31b474);
    (pfVar5->data).l2_lambda = fVar1;
    if ((local_18->quiet & 1U) == 0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Enabling FTRL based optimization");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cerr,"Algorithm used: ");
      poVar6 = std::operator<<(poVar6,local_668);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cerr,"ftrl_alpha = ");
      pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31b543);
      pvVar7 = (void *)std::ostream::operator<<(poVar6,pfVar5->ftrl_alpha);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cerr,"ftrl_beta = ");
      pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31b593);
      pvVar7 = (void *)std::ostream::operator<<(poVar6,pfVar5->ftrl_beta);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    }
    if ((local_18->holdout_set_off & 1U) == 0) {
      local_18->sd->holdout_best_loss = 3.4028234663852886e+38;
      paVar9 = &local_689;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_688,"early_terminate",paVar9);
      VW::config::options_i::get_typed_option<unsigned_long>
                ((options_i *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                 in_stack_fffffffffffff788);
      uVar8 = VW::config::typed_option<unsigned_long>::value
                        ((typed_option<unsigned_long> *)in_stack_fffffffffffff760);
      pfVar5 = std::unique_ptr<ftrl,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ftrl,_void_(*)(void_*)> *)0x31b660);
      pfVar5->early_stop_thres = uVar8;
      std::__cxx11::string::~string(local_688);
      std::allocator<char>::~allocator((allocator<char> *)&local_689);
    }
    if (((local_18->audit & 1U) == 0) && ((local_18->hash_inv & 1U) == 0)) {
      in_stack_fffffffffffff770 = local_648;
      in_stack_fffffffffffff77c =
           parameters::stride_shift
                     ((parameters *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
      local_698 = LEARNER::init_learner<ftrl,example,LEARNER::learner<char,example>>
                            (in_stack_fffffffffffff770,
                             (_func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffff768,
                             (_func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffff760,
                             CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
    }
    else {
      parameters::stride_shift
                ((parameters *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
      in_stack_fffffffffffff780 =
           LEARNER::init_learner<ftrl,example,LEARNER::learner<char,example>>
                     (in_stack_fffffffffffff770,
                      (_func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffff768,
                      (_func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffff760,
                      CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
      local_698 = in_stack_fffffffffffff780;
    }
    LEARNER::learner<ftrl,_example>::set_sensitivity(local_698,sensitivity);
    if (((local_18->audit & 1U) == 0) && ((local_18->hash_inv & 1U) == 0)) {
      LEARNER::learner<ftrl,example>::set_multipredict<LEARNER::learner<char,char>>
                ((learner<ftrl,example> *)local_698,multipredict<false>);
    }
    else {
      LEARNER::learner<ftrl,example>::set_multipredict<LEARNER::learner<char,char>>
                ((learner<ftrl,example> *)local_698,multipredict<true>);
    }
    LEARNER::learner<ftrl,_example>::set_save_load(local_698,save_load);
    LEARNER::learner<ftrl,_example>::set_end_pass
              (in_stack_fffffffffffff780,
               (_func_void_ftrl_ptr *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778))
    ;
    in_stack_fffffffffffff760 = (typed_option<float> *)LEARNER::make_base<ftrl,example>(local_698);
    local_550 = 1;
    local_8 = in_stack_fffffffffffff760;
    std::__cxx11::string::~string(local_668);
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff760);
  std::unique_ptr<ftrl,_void_(*)(void_*)>::~unique_ptr(in_stack_fffffffffffff770);
  return (base_learner *)local_8;
}

Assistant:

base_learner* ftrl_setup(options_i& options, vw& all)
{
  auto b = scoped_calloc_or_throw<ftrl>();
  bool ftrl_option = false;
  bool pistol = false;
  bool coin = false;

  option_group_definition new_options("Follow the Regularized Leader");
  new_options.add(make_option("ftrl", ftrl_option).keep().help("FTRL: Follow the Proximal Regularized Leader"))
      .add(make_option("coin", coin).keep().help("Coin betting optimizer"))
      .add(make_option("pistol", pistol).keep().help("PiSTOL: Parameter-free STOchastic Learning"))
      .add(make_option("ftrl_alpha", b->ftrl_alpha).help("Learning rate for FTRL optimization"))
      .add(make_option("ftrl_beta", b->ftrl_beta).help("Learning rate for FTRL optimization"));
  options.add_and_parse(new_options);

  if (!ftrl_option && !pistol && !coin)
  {
    return nullptr;
  }

  // Defaults that are specific to the mode that was chosen.
  if (ftrl_option)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 0.005f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 0.1f;
  }
  else if (pistol)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 1.0f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 0.5f;
  }
  else if (coin)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 4.0f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 1.0f;
  }


  b->all = &all;
  b->no_win_counter = 0;
  b->all->normalized_sum_norm_x = 0;
  b->total_weight = 0.;

  void (*learn_ptr)(ftrl&, single_learner&, example&) = nullptr;

  string algorithm_name;
  if (ftrl_option)
  {
    algorithm_name = "Proximal-FTRL";
    if (all.audit)
      learn_ptr = learn_proximal<true>;
    else
      learn_ptr = learn_proximal<false>;
      all.weights.stride_shift(2);  // NOTE: for more parameter storage
  }
  else if (pistol)
  {
    algorithm_name = "PiSTOL";
    learn_ptr = learn_pistol;
    all.weights.stride_shift(2);  // NOTE: for more parameter storage
  }
  else if (coin)
  {
    algorithm_name = "Coin Betting";
    learn_ptr = learn_cb;
    all.weights.stride_shift(3);  // NOTE: for more parameter storage
  }

  b->data.ftrl_alpha = b->ftrl_alpha;
  b->data.ftrl_beta = b->ftrl_beta;
  b->data.l1_lambda = b->all->l1_lambda;
  b->data.l2_lambda = b->all->l2_lambda;

  if (!all.quiet)
  {
    cerr << "Enabling FTRL based optimization" << endl;
    cerr << "Algorithm used: " << algorithm_name << endl;
    cerr << "ftrl_alpha = " << b->ftrl_alpha << endl;
    cerr << "ftrl_beta = " << b->ftrl_beta << endl;
  }

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    b->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  learner<ftrl, example>* l;
  if (all.audit || all.hash_inv)
    l = &init_learner(b, learn_ptr, predict<true>, UINT64_ONE << all.weights.stride_shift());
  else
    l = &init_learner(b, learn_ptr, predict<false>, UINT64_ONE << all.weights.stride_shift());
  l->set_sensitivity(sensitivity);
  if (all.audit || all.hash_inv)
    l->set_multipredict(multipredict<true>);
  else
    l->set_multipredict(multipredict<false>);
  l->set_save_load(save_load);
  l->set_end_pass(end_pass);
  return make_base(*l);
}